

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_transaction.cpp
# Opt level: O1

void __thiscall
TransactionApi_FundRawTransaction_MillionAmountValue_Test::TestBody
          (TransactionApi_FundRawTransaction_MillionAmountValue_Test *this)

{
  ByteData *pBVar1;
  Txid *this_00;
  Txid *this_01;
  pointer pcVar2;
  pointer puVar3;
  bool bVar4;
  uint32_t uVar5;
  char *message;
  _func_int *p_Var6;
  long lVar7;
  Amount AVar8;
  initializer_list<cfd::UtxoData> __l;
  AssertionResult gtest_ar_2;
  TransactionApi api;
  uint32_t minimum_fee;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Amount estimate_fee;
  AddressFactory factory;
  Amount target_value;
  Amount fee;
  TransactionContext txc;
  CoinSelectionOption option;
  AssertionResult gtest_ar;
  Address address;
  TransactionController tx_obj;
  Address address3;
  Address address2;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  undefined1 local_24f8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_24f0;
  long local_24e8 [2];
  Privkey local_24d8;
  TransactionApi local_24b1;
  pointer local_24b0;
  ByteData local_24a8;
  string local_2490;
  Pubkey local_2470;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2458;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2440;
  Amount local_2428;
  SigHashType local_2414;
  SigHashType local_2408;
  SigHashType local_23fc;
  AddressFactory local_23f0;
  Amount local_23c8;
  Amount local_23b8;
  TransactionContext local_23a8;
  undefined1 local_22f0 [56];
  undefined **local_22b8;
  pointer local_22b0;
  undefined1 local_2288 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_2280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2278;
  uchar local_2268 [16];
  pointer local_2258;
  pointer local_2240;
  pointer local_2228;
  TapBranch local_2210;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_2198;
  Script local_2180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2140 [19];
  UtxoData local_1d98;
  UtxoData local_18a8;
  undefined1 local_13b8 [32];
  undefined1 local_1398 [16];
  pointer local_1388;
  pointer local_1370;
  pointer local_1358;
  TapBranch local_1340;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_12c8;
  Script local_12b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1270;
  TransactionController local_1240;
  Address local_11f0;
  Address local_1078;
  UtxoData local_f00;
  UtxoData local_a10;
  UtxoData local_520;
  
  cfd::AddressFactory::AddressFactory(&local_23f0,kRegtest);
  cfd::UtxoData::UtxoData(&local_520);
  local_520.block_height = 0;
  local_520.binary_data = (void *)0x0;
  pBVar1 = &local_a10.block_hash.data_;
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_2288,(string *)&local_a10);
  this_00 = &local_520.txid;
  cfd::core::Txid::operator=(this_00,(Txid *)local_2288);
  local_2288 = (undefined1  [8])&PTR__Txid_00735400;
  if (sStack_2280.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_2280.ptr_);
  }
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  local_520.vout = 0;
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_2288,(string *)&local_a10);
  cfd::core::Script::operator=(&local_520.locking_script,(Script *)local_2288);
  cfd::core::Script::~Script((Script *)local_2288);
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW","");
  cfd::AddressFactory::GetAddress((Address *)local_2288,&local_23f0,(string *)&local_a10);
  cfd::core::Address::operator=(&local_520.address,(Address *)local_2288);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_2140);
  cfd::core::Script::~Script(&local_2180);
  local_24b0 = (pointer)&PTR__TaprootScriptTree_00740b18;
  local_2210._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_2198)
  ;
  cfd::core::TapBranch::~TapBranch(&local_2210);
  if (local_2228 != (pointer)0x0) {
    operator_delete(local_2228);
  }
  if (local_2240 != (pointer)0x0) {
    operator_delete(local_2240);
  }
  if (local_2258 != (pointer)0x0) {
    operator_delete(local_2258);
  }
  if ((uchar *)local_2278._M_allocated_capacity != local_2268) {
    operator_delete((void *)local_2278._M_allocated_capacity);
  }
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_520.descriptor,0,(char *)local_520.descriptor._M_string_length,0x58eab2);
  cfd::core::Amount::Amount((Amount *)local_2288,300000000000000);
  local_520.amount.ignore_check_ = sStack_2280.ptr_._0_1_;
  local_520.amount.amount_ = (int64_t)local_2288;
  local_520.address_type = kP2pkhAddress;
  cfd::UtxoData::UtxoData(&local_a10);
  local_a10.block_height = 0;
  local_a10.binary_data = (void *)0x0;
  pBVar1 = &local_f00.block_hash.data_;
  local_f00.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_2288,(string *)&local_f00);
  this_01 = &local_a10.txid;
  cfd::core::Txid::operator=(this_01,(Txid *)local_2288);
  local_2288 = (undefined1  [8])&PTR__Txid_00735400;
  if (sStack_2280.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_2280.ptr_);
  }
  if ((ByteData *)local_f00.block_height != pBVar1) {
    operator_delete((void *)local_f00.block_height);
  }
  local_a10.vout = 0;
  local_f00.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_2288,(string *)&local_f00);
  cfd::core::Script::operator=(&local_a10.locking_script,(Script *)local_2288);
  cfd::core::Script::~Script((Script *)local_2288);
  if ((ByteData *)local_f00.block_height != pBVar1) {
    operator_delete((void *)local_f00.block_height);
  }
  local_f00.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16","");
  cfd::AddressFactory::GetAddress((Address *)local_2288,&local_23f0,(string *)&local_f00);
  cfd::core::Address::operator=(&local_a10.address,(Address *)local_2288);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_2140);
  cfd::core::Script::~Script(&local_2180);
  local_2210._vptr_TapBranch = (_func_int **)local_24b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_2198)
  ;
  cfd::core::TapBranch::~TapBranch(&local_2210);
  if (local_2228 != (pointer)0x0) {
    operator_delete(local_2228);
  }
  if (local_2240 != (pointer)0x0) {
    operator_delete(local_2240);
  }
  if (local_2258 != (pointer)0x0) {
    operator_delete(local_2258);
  }
  if ((uchar *)local_2278._M_allocated_capacity != local_2268) {
    operator_delete((void *)local_2278._M_allocated_capacity);
  }
  if ((ByteData *)local_f00.block_height != pBVar1) {
    operator_delete((void *)local_f00.block_height);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_a10.descriptor,0,(char *)local_a10.descriptor._M_string_length,0x554123);
  cfd::core::Amount::Amount((Amount *)local_2288,400000000000000);
  local_a10.amount.ignore_check_ = sStack_2280.ptr_._0_1_;
  local_a10.amount.amount_ = (int64_t)local_2288;
  local_a10.address_type = kP2shP2wpkhAddress;
  cfd::UtxoData::UtxoData(&local_f00);
  local_f00.block_height = 0;
  local_f00.binary_data = (void *)0x0;
  pcVar2 = local_13b8 + 0x10;
  local_13b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13b8,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_2288,(string *)local_13b8);
  cfd::core::Txid::operator=(&local_f00.txid,(Txid *)local_2288);
  local_2288 = (undefined1  [8])&PTR__Txid_00735400;
  if (sStack_2280.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete(sStack_2280.ptr_);
  }
  if ((pointer)local_13b8._0_8_ != pcVar2) {
    operator_delete((void *)local_13b8._0_8_);
  }
  local_f00.vout = 1;
  local_13b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13b8,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4","");
  cfd::core::Script::Script((Script *)local_2288,(string *)local_13b8);
  cfd::core::Script::operator=(&local_f00.locking_script,(Script *)local_2288);
  cfd::core::Script::~Script((Script *)local_2288);
  if ((pointer)local_13b8._0_8_ != pcVar2) {
    operator_delete((void *)local_13b8._0_8_);
  }
  local_13b8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13b8,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w","");
  cfd::AddressFactory::GetAddress((Address *)local_2288,&local_23f0,(string *)local_13b8);
  cfd::core::Address::operator=(&local_f00.address,(Address *)local_2288);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_2140);
  cfd::core::Script::~Script(&local_2180);
  local_2210._vptr_TapBranch = (_func_int **)local_24b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_2198)
  ;
  cfd::core::TapBranch::~TapBranch(&local_2210);
  if (local_2228 != (pointer)0x0) {
    operator_delete(local_2228);
  }
  if (local_2240 != (pointer)0x0) {
    operator_delete(local_2240);
  }
  if (local_2258 != (pointer)0x0) {
    operator_delete(local_2258);
  }
  if ((uchar *)local_2278._M_allocated_capacity != local_2268) {
    operator_delete((void *)local_2278._M_allocated_capacity);
  }
  if ((pointer)local_13b8._0_8_ != pcVar2) {
    operator_delete((void *)local_13b8._0_8_);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_f00.descriptor,0,(char *)local_f00.descriptor._M_string_length,0x58eab1);
  cfd::core::Amount::Amount((Amount *)local_2288,300000000000000);
  local_f00.amount.ignore_check_ = sStack_2280.ptr_._0_1_;
  local_f00.amount.amount_ = (int64_t)local_2288;
  local_f00.address_type = kP2wpkhAddress;
  local_2288 = (undefined1  [8])&local_2278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2288,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo","");
  cfd::core::Address::Address((Address *)local_13b8,(string *)local_2288);
  if (local_2288 != (undefined1  [8])&local_2278) {
    operator_delete((void *)local_2288);
  }
  local_2288 = (undefined1  [8])&local_2278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2288,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu","");
  cfd::core::Address::Address(&local_1078,(string *)local_2288);
  if (local_2288 != (undefined1  [8])&local_2278) {
    operator_delete((void *)local_2288);
  }
  local_2288 = (undefined1  [8])&local_2278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2288,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w","");
  cfd::core::Address::Address(&local_11f0,(string *)local_2288);
  if (local_2288 != (undefined1  [8])&local_2278) {
    operator_delete((void *)local_2288);
  }
  cfd::core::Amount::Amount(&local_23b8,10000);
  cfd::TransactionContext::TransactionContext(&local_23a8,2,0);
  AVar8 = cfd::core::operator+(&local_520.amount,&local_f00.amount);
  local_22f0._0_8_ = AVar8.amount_;
  local_22f0[8] = AVar8.ignore_check_;
  AVar8 = cfd::core::operator-((Amount *)local_22f0,&local_23b8);
  local_2288 = (undefined1  [8])AVar8.amount_;
  sStack_2280.ptr_._0_1_ = AVar8.ignore_check_;
  cfd::TransactionContext::AddTxOut(&local_23a8,(Address *)local_13b8,(Amount *)local_2288);
  cfd::TransactionContext::AddTxOut(&local_23a8,&local_1078,&local_a10.amount);
  cfd::UtxoData::UtxoData((UtxoData *)local_2288,&local_520);
  cfd::UtxoData::UtxoData(&local_1d98,&local_a10);
  cfd::UtxoData::UtxoData(&local_18a8,&local_f00);
  __l._M_len = 3;
  __l._M_array = (iterator)local_2288;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_2440,__l,(allocator_type *)local_22f0);
  lVar7 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_2288 + lVar7));
    lVar7 = lVar7 + -0x4f0;
  } while (lVar7 != -0x4f0);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)local_22f0);
  local_2458.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2458.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2458.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&local_23c8);
  cfd::core::Amount::Amount(&local_2428);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_2288,(AbstractTransaction *)&local_23a8);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_24f8,&local_11f0);
  cfd::api::TransactionApi::FundRawTransaction
            (&local_1240,&local_24b1,(string *)local_2288,&local_2440,&local_23c8,&local_2458,
             (string *)local_24f8,20.0,&local_2428,(UtxoFilter *)0x0,
             (CoinSelectionOption *)local_22f0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0,kCfdIllegalStateError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  if (local_24f8 != (undefined1  [8])local_24e8) {
    operator_delete((void *)local_24f8);
  }
  if (local_2288 != (undefined1  [8])&local_2278) {
    operator_delete((void *)local_2288);
  }
  local_24f8 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue(&local_2428);
  local_24d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_24d8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x20a8);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_2288,"estimate_fee.GetSatoshiValue()","8360",(long *)local_24f8,
             (int *)&local_24d8);
  if (local_2288[0] == (string)0x0) {
    testing::Message::Message((Message *)local_24f8);
    if (sStack_2280.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var6 = (_func_int *)0x62864a;
    }
    else {
      p_Var6 = (_func_int *)((sStack_2280.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_24d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0xf7,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_24d8,(Message *)local_24f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24d8);
    if (local_24f8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_24f8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_24f8 + 8))();
      }
      local_24f8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_2280,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_24f8,&local_1240.super_AbstractTransactionController);
  cfd::TransactionContext::TransactionContext((TransactionContext *)local_2288,(string *)local_24f8)
  ;
  cfd::TransactionContext::operator=(&local_23a8,(TransactionContext *)local_2288);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)local_2288);
  if (local_24f8 != (undefined1  [8])local_24e8) {
    operator_delete((void *)local_24f8);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::TransactionContext::CollectInputUtxo(&local_23a8,&local_2440);
    }
  }
  else {
    testing::Message::Message((Message *)local_2288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_24f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0xfa,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_24f8,(Message *)local_2288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_24f8);
    if (local_2288 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2288 + 8))();
      }
      local_2288 = (undefined1  [8])0x0;
    }
  }
  cfd::core::ByteData::ByteData(&local_24a8);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2288,this_00,local_520.vout);
      local_24f8 = (undefined1  [8])local_24e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_24f8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2470,(string *)local_24f8);
      local_2490._M_dataplus._M_p = (pointer)&local_2490.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2490,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_24d8,&local_2490,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_23fc);
      cfd::TransactionContext::SignWithKey
                (&local_23a8,(OutPoint *)local_2288,&local_2470,&local_24d8,&local_23fc,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_24d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_24d8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2490._M_dataplus._M_p != &local_2490.field_2) {
        operator_delete(local_2490._M_dataplus._M_p);
      }
      if (local_2470.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2470.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_24f8 != (undefined1  [8])local_24e8) {
        operator_delete((void *)local_24f8);
      }
      local_2288 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2280.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2280.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_24f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x101,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_24f8,(Message *)local_2288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_24f8);
    if (local_2288 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2288 + 8))();
      }
      local_2288 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2288,this_00,local_520.vout);
      cfd::TransactionContext::Verify(&local_23a8,(OutPoint *)local_2288);
      local_2288 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2280.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2280.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_24f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x102,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_24f8,(Message *)local_2288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_24f8);
    if (local_2288 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2288 + 8))();
      }
      local_2288 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::TransactionContext::Finalize((ByteData *)local_2288,&local_23a8);
    puVar3 = local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_2288;
    local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)sStack_2280.ptr_;
    local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_2278._M_allocated_capacity;
    local_2288 = (undefined1  [8])0x0;
    sStack_2280.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2278._M_allocated_capacity = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(puVar3);
    }
    if (local_2288 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2288);
    }
  }
  testing::Message::Message((Message *)local_2288);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_24f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
             ,0x103,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_24f8,(Message *)local_2288);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_24f8);
  if (local_2288 != (undefined1  [8])0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_2288 + 8))();
    }
    local_2288 = (undefined1  [8])0x0;
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2288,this_01,local_a10.vout);
      local_24f8 = (undefined1  [8])local_24e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_24f8,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_2470,(string *)local_24f8);
      local_2490._M_dataplus._M_p = (pointer)&local_2490.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2490,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif(&local_24d8,&local_2490,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2408);
      cfd::TransactionContext::SignWithKey
                (&local_23a8,(OutPoint *)local_2288,&local_2470,&local_24d8,&local_2408,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_24d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_24d8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2490._M_dataplus._M_p != &local_2490.field_2) {
        operator_delete(local_2490._M_dataplus._M_p);
      }
      if (local_2470.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2470.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_24f8 != (undefined1  [8])local_24e8) {
        operator_delete((void *)local_24f8);
      }
      local_2288 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2280.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2280.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_24f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x108,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_24f8,(Message *)local_2288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_24f8);
    if (local_2288 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2288 + 8))();
      }
      local_2288 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2288,this_01,local_a10.vout);
      cfd::TransactionContext::Verify(&local_23a8,(OutPoint *)local_2288);
      local_2288 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2280.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2280.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_24f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x109,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_24f8,(Message *)local_2288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_24f8);
    if (local_2288 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2288 + 8))();
      }
      local_2288 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::TransactionContext::Finalize((ByteData *)local_2288,&local_23a8);
    puVar3 = local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_2288;
    local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)sStack_2280.ptr_;
    local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_2278._M_allocated_capacity;
    local_2288 = (undefined1  [8])0x0;
    sStack_2280.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2278._M_allocated_capacity = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(puVar3);
    }
    if (local_2288 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2288);
    }
  }
  testing::Message::Message((Message *)local_2288);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_24f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
             ,0x10a,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_24f8,(Message *)local_2288);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_24f8);
  if (local_2288 != (undefined1  [8])0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_2288 + 8))();
    }
    local_2288 = (undefined1  [8])0x0;
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2288,&local_f00.txid,local_f00.vout);
      local_24f8 = (undefined1  [8])local_24e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_24f8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2470,(string *)local_24f8);
      local_2490._M_dataplus._M_p = (pointer)&local_2490.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2490,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_24d8,&local_2490,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2414);
      cfd::TransactionContext::SignWithKey
                (&local_23a8,(OutPoint *)local_2288,&local_2470,&local_24d8,&local_2414,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      if (local_24d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_24d8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2490._M_dataplus._M_p != &local_2490.field_2) {
        operator_delete(local_2490._M_dataplus._M_p);
      }
      if (local_2470.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2470.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_24f8 != (undefined1  [8])local_24e8) {
        operator_delete((void *)local_24f8);
      }
      local_2288 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2280.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2280.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_24f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x10f,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_24f8,(Message *)local_2288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_24f8);
    if (local_2288 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2288 + 8))();
      }
      local_2288 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2288,&local_f00.txid,local_f00.vout);
      cfd::TransactionContext::Verify(&local_23a8,(OutPoint *)local_2288);
      local_2288 = (undefined1  [8])&PTR__Txid_00735400;
      if (sStack_2280.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete(sStack_2280.ptr_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_24f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x110,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_24f8,(Message *)local_2288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_24f8);
    if (local_2288 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2288 + 8))();
      }
      local_2288 = (undefined1  [8])0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::TransactionContext::Finalize((ByteData *)local_2288,&local_23a8);
      puVar3 = local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_2288;
      local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)sStack_2280.ptr_;
      local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_2278._M_allocated_capacity;
      local_2288 = (undefined1  [8])0x0;
      sStack_2280.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_2278._M_allocated_capacity = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar3 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(puVar3);
      }
      if (local_2288 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2288);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_24f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x112,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_24f8,(Message *)local_2288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_24f8);
    if (local_2288 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2288 + 8))();
      }
      local_2288 = (undefined1  [8])0x0;
    }
  }
  AVar8 = cfd::TransactionContext::GetFeeAmount(&local_23a8);
  local_24f8 = (undefined1  [8])AVar8.amount_;
  local_24f0.ptr_._0_1_ = AVar8.ignore_check_;
  local_24d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_24f8);
  local_2490._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_2428);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_2288,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)&local_24d8,(long *)&local_2490);
  if (local_2288[0] == (string)0x0) {
    testing::Message::Message((Message *)local_24f8);
    if (sStack_2280.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var6 = (_func_int *)0x62864a;
    }
    else {
      p_Var6 = (_func_int *)((sStack_2280.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_24d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x113,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_24d8,(Message *)local_24f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24d8);
    if (local_24f8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_24f8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_24f8 + 8))();
      }
      local_24f8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_2280,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2288,&local_24a8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_24f8,"tx.GetHex().c_str()",
             "\"02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a4730440220644d3014684db32df93e6e342e2d0872aa6272d3a9cdce021138592ef78fc2a8022054a2a85c6339dee9578d9989920100f0660bd45b9cf7b14444f012bf5ee0bd7601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f058dd62b22102001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0000e941cc6b010016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402202ece1dae47832c07863b5052133c9af652e9521e0fbaf4ef7558ca45ec739ca902205ad29147c0f5f16277a7a00391f8b5d43b9b6c149721cdb4591ba18c701dbd5f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2702473044022058e88c67379c5b5c49dfef09eb069833ba9ae7cd6f8a5f9bdcf657ed8ad91b820220039739df97dc8488a93f61000cbade6d48df737238519660a02071795aabd74801210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000\""
             ,(char *)local_2288,
             "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a4730440220644d3014684db32df93e6e342e2d0872aa6272d3a9cdce021138592ef78fc2a8022054a2a85c6339dee9578d9989920100f0660bd45b9cf7b14444f012bf5ee0bd7601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f058dd62b22102001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0000e941cc6b010016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402202ece1dae47832c07863b5052133c9af652e9521e0fbaf4ef7558ca45ec739ca902205ad29147c0f5f16277a7a00391f8b5d43b9b6c149721cdb4591ba18c701dbd5f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2702473044022058e88c67379c5b5c49dfef09eb069833ba9ae7cd6f8a5f9bdcf657ed8ad91b820220039739df97dc8488a93f61000cbade6d48df737238519660a02071795aabd74801210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000"
            );
  if (local_2288 != (undefined1  [8])&local_2278) {
    operator_delete((void *)local_2288);
  }
  if (local_24f8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2288);
    if ((undefined8 *)CONCAT71(local_24f0.ptr_._1_7_,local_24f0.ptr_._0_1_) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT71(local_24f0.ptr_._1_7_,local_24f0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_24d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x114,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_24d8,(Message *)local_2288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24d8);
    if (local_2288 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_2288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2288 + 8))();
      }
      local_2288 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_24f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetVsize(&local_23a8.super_Transaction);
  local_24f8._0_4_ = uVar5;
  local_24d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_24d8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x19d);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2288,"txc.GetVsize()","413",(uint *)local_24f8,(int *)&local_24d8);
  if (local_2288[0] == (string)0x0) {
    testing::Message::Message((Message *)local_24f8);
    if (sStack_2280.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var6 = (_func_int *)0x62864a;
    }
    else {
      p_Var6 = (_func_int *)((sStack_2280.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_24d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x115,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_24d8,(Message *)local_24f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24d8);
    if (local_24f8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_24f8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_24f8 + 8))();
      }
      local_24f8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_2280,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetVsize(&local_23a8.super_Transaction);
  local_2490._M_dataplus._M_p._0_4_ = uVar5 * 0x14;
  local_24f8._0_4_ = 0x2044;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2288,"minimum_fee","8260",(uint *)&local_2490,(int *)local_24f8);
  if (local_2288[0] == (string)0x0) {
    testing::Message::Message((Message *)local_24f8);
    if (sStack_2280.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      p_Var6 = (_func_int *)0x62864a;
    }
    else {
      p_Var6 = (_func_int *)((sStack_2280.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_24d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x118,(char *)p_Var6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_24d8,(Message *)local_24f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24d8);
    if (local_24f8 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_24f8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_24f8 + 8))();
      }
      local_24f8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_2280,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_24a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_24a8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1240.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__TransactionController_00736ad0;
  cfd::core::Transaction::~Transaction(&local_1240.transaction_);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2458);
  local_22b8 = &PTR__ConfidentialAssetId_00735710;
  if (local_22b0 != (pointer)0x0) {
    operator_delete(local_22b0);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2440);
  cfd::TransactionContext::~TransactionContext(&local_23a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_11f0.format_data_);
  cfd::core::Script::~Script(&local_11f0.redeem_script_);
  local_11f0.script_tree_.super_TapBranch._vptr_TapBranch = (_func_int **)local_24b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_11f0.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_11f0.script_tree_.super_TapBranch);
  if (local_11f0.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11f0.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_11f0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11f0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_11f0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_11f0.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11f0.address_._M_dataplus._M_p != &local_11f0.address_.field_2) {
    operator_delete(local_11f0.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1078.format_data_);
  cfd::core::Script::~Script(&local_1078.redeem_script_);
  local_1078.script_tree_.super_TapBranch._vptr_TapBranch = (_func_int **)local_24b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_1078.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_1078.script_tree_.super_TapBranch);
  if (local_1078.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1078.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1078.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1078.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1078.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1078.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078.address_._M_dataplus._M_p != &local_1078.address_.field_2) {
    operator_delete(local_1078.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1270);
  cfd::core::Script::~Script(&local_12b0);
  local_1340._vptr_TapBranch = (_func_int **)local_24b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_12c8)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1340);
  if (local_1358 != (pointer)0x0) {
    operator_delete(local_1358);
  }
  if (local_1370 != (pointer)0x0) {
    operator_delete(local_1370);
  }
  if (local_1388 != (pointer)0x0) {
    operator_delete(local_1388);
  }
  if ((undefined1 *)local_13b8._16_8_ != local_1398) {
    operator_delete((void *)local_13b8._16_8_);
  }
  cfd::UtxoData::~UtxoData(&local_f00);
  cfd::UtxoData::~UtxoData(&local_a10);
  cfd::UtxoData::~UtxoData(&local_520);
  local_23f0._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_23f0.prefix_list_);
  return;
}

Assistant:

TEST(TransactionApi, FundRawTransaction_MillionAmountValue) {
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{300000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{400000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{300000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");
  Address address3("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  double effective_fee_rate = 20.0;
  CoinSelectionOption option;
  std::vector<UtxoData> selected_txin_utxos;
  Amount target_value;
  Amount estimate_fee;


  TransactionApi api;
  auto tx_obj = api.FundRawTransaction(
      txc.GetHex(), utxos, target_value, selected_txin_utxos, address3.GetAddress(),
      effective_fee_rate, &estimate_fee, nullptr, &option, nullptr, NetType::kRegtest);
  EXPECT_EQ(estimate_fee.GetSatoshiValue(), 8360);

  txc = TransactionContext(tx_obj.GetHex());
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a4730440220644d3014684db32df93e6e342e2d0872aa6272d3a9cdce021138592ef78fc2a8022054a2a85c6339dee9578d9989920100f0660bd45b9cf7b14444f012bf5ee0bd7601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f058dd62b22102001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0000e941cc6b010016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402202ece1dae47832c07863b5052133c9af652e9521e0fbaf4ef7558ca45ec739ca902205ad29147c0f5f16277a7a00391f8b5d43b9b6c149721cdb4591ba18c701dbd5f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2702473044022058e88c67379c5b5c49dfef09eb069833ba9ae7cd6f8a5f9bdcf657ed8ad91b820220039739df97dc8488a93f61000cbade6d48df737238519660a02071795aabd74801210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000");
  EXPECT_EQ(txc.GetVsize(), 413);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate);
  EXPECT_EQ(minimum_fee, 8260);
}